

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LimitQueryCase::iterate(LimitQueryCase *this)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  deBool dVar3;
  int iVar4;
  RenderContext *pRVar5;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  undefined4 extraout_var;
  TestLog *pTVar6;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  ResultCollector result;
  CallLogWrapper gl;
  bool supportsES32;
  LimitQueryCase_conflict1 *this_local;
  
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  while( true ) {
    dVar3 = ::deGetFalse();
    if (dVar3 != 0) break;
    if (!bVar1) {
      this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_texture_buffer");
      if (!bVar2) break;
    }
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar4 = (*pRVar5->_vptr_RenderContext[3])();
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::CallLogWrapper::CallLogWrapper
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
                 (Functions *)CONCAT44(extraout_var,iVar4),pTVar6);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8," // ERROR: ",&local_b9);
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_98,pTVar6,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      glu::CallLogWrapper::enableLogging
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
      deqp::gls::StateQueryUtil::verifyStateIntegerMin
                ((ResultCollector *)local_98,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,this->m_type,this->m_limit,this->m_target);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_98,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_98);
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      return STOP;
    }
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"GL_EXT_texture_buffer is not supported",
             "supportsES32 || m_context.getContextInfo().isExtensionSupported(\"GL_EXT_texture_buffer\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBufferTests.cpp"
             ,0x9b);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

LimitQueryCase::IterateResult LimitQueryCase::iterate (void)
{
	checkTessellationSupport(m_context);

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);
	verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_INTEGER);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
		verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_BOOLEAN);
		verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_INTEGER64);
		verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_FLOAT);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}